

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O2

string * __thiscall
Shell::TermAlgebra::getSubtermPredicateName_abi_cxx11_
          (string *__return_storage_ptr__,TermAlgebra *this)

{
  std::operator+(__return_storage_ptr__,"$subterm",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (*(long *)(DAT_00a14190 + 0xa0) + (ulong)*(uint *)((this->_sort)._content + 8) * 8
                  ));
  return __return_storage_ptr__;
}

Assistant:

std::string TermAlgebra::getSubtermPredicateName() {
  return "$subterm" + env.signature->getTypeCon(_sort.term()->functor())->name();
}